

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void av1_alloc_cdef_buffers
               (AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync,
               int num_workers,int init_worker)

{
  uint16_t **srcbuf;
  int iVar1;
  uint uVar2;
  SequenceHeader *pSVar3;
  AV1CdefSync *pAVar4;
  int iVar5;
  uint16_t *puVar6;
  AV1CdefWorkerData *pAVar7;
  AV1CdefRowSync *pAVar8;
  void *pvVar9;
  byte bVar10;
  ulong uVar11;
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  ulong uVar12;
  undefined8 in_R11;
  int plane_1;
  long lVar13;
  long alStack_5c30 [2928];
  undefined8 uStack_b0;
  AV1CdefSync *local_a8;
  int local_a0;
  uint local_9c;
  size_t local_98;
  ulong local_90;
  undefined4 local_88;
  int local_84;
  CdefInfo *local_80;
  size_t new_colbuf_size [3];
  size_t new_linebuf_size [3];
  
  pSVar3 = cm->seq_params;
  local_9c = (uint)(pSVar3->monochrome == '\0') * 2 + 1;
  new_linebuf_size[0] = 0;
  new_linebuf_size[1] = 0;
  new_linebuf_size[2] = 0;
  new_colbuf_size[0] = 0;
  new_colbuf_size[1] = 0;
  new_colbuf_size[2] = 0;
  local_84 = ((cm->mi_params).mi_rows + 0xf) / 0x10;
  if (pSVar3->enable_cdef == '\0') {
    local_88 = 0;
  }
  else {
    local_88 = (undefined4)
               CONCAT71((int7)((ulong)in_R11 >> 8),(cm->tiles).single_tile_decoding == 0);
  }
  lVar13 = 0x60;
  if (1 < num_workers) {
    lVar13 = (long)local_84 << 5;
  }
  uVar11 = (ulong)local_9c;
  if ((char)local_88 == '\0') {
    local_98 = 0;
  }
  else {
    iVar1 = (cm->mi_params).mi_cols;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      if (uVar12 == 0) {
        bVar10 = 0;
      }
      else {
        bVar10 = (byte)pSVar3->subsampling_x;
      }
      new_linebuf_size[uVar12] = ((int)(iVar1 * 4 + 0xfU & 0xfffffff0) >> (bVar10 & 0x1f)) * lVar13;
      new_colbuf_size[uVar12] = (long)(0x100 << (2 - bVar10 & 0x1f)) << 4;
    }
    local_98 = 0x9480;
  }
  local_80 = &cm->cdef_info;
  iVar1 = (cm->cdef_info).allocated_num_workers;
  local_a8 = cdef_sync;
  local_a0 = init_worker;
  for (lVar13 = 0xb7b; lVar13 != 0xb7e; lVar13 = lVar13 + 1) {
    if (alStack_5c30[lVar13] != *(long *)(cm->buffer_removal_times + lVar13 * 2 + -7)) {
      uStack_b0 = 0x31c464;
      aom_free(*(void **)(cm->buffer_removal_times + lVar13 * 2 + -0x15));
      (cm->buffer_removal_times + lVar13 * 2 + -0x15)[0] = 0;
      (cm->buffer_removal_times + lVar13 * 2 + -0x15)[1] = 0;
    }
  }
  srcbuf = &(cm->cdef_info).srcbuf;
  uStack_b0 = 0x31c491;
  free_cdef_bufs_conditional(cm,local_80->colbuf,srcbuf,new_colbuf_size,local_98);
  uVar12 = (ulong)(uint)num_workers;
  local_90 = uVar12;
  if ((local_a0 != 0) && (*cdef_worker != (AV1CdefWorkerData *)0x0)) {
    if (iVar1 == num_workers) {
      if (1 < num_workers) {
        lVar13 = uVar12 * 0x1f8 + -0x1e8;
        for (; 1 < (long)uVar12; uVar12 = uVar12 - 1) {
          uStack_b0 = 0x31c4f7;
          free_cdef_bufs_conditional
                    (cm,(uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + -0x10),
                     (uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + 8),new_colbuf_size,
                     local_98);
          lVar13 = lVar13 + -0x1f8;
        }
      }
    }
    else {
      uVar12 = (ulong)(uint)(cm->cdef_info).allocated_num_workers;
      lVar13 = uVar12 * 0x1f8 + -0x1e8;
      for (; 1 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
        uStack_b0 = 0x31c52e;
        free_cdef_bufs((uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + -0x10),
                       (uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + 8));
        lVar13 = lVar13 + -0x1f8;
      }
      uStack_b0 = 0x31c542;
      aom_free(*cdef_worker);
      *cdef_worker = (AV1CdefWorkerData *)0x0;
    }
  }
  iVar5 = local_84;
  iVar1 = (cm->cdef_info).allocated_mi_rows;
  if (iVar1 != local_84) {
    uStack_b0 = 0x31c564;
    free_cdef_row_sync(&local_a8->cdef_row_mt,iVar1);
  }
  (cm->cdef_info).allocated_srcbuf_size = local_98;
  (cm->cdef_info).allocated_colbuf_size[2] = new_colbuf_size[2];
  (cm->cdef_info).allocated_colbuf_size[0] = new_colbuf_size[0];
  (cm->cdef_info).allocated_colbuf_size[1] = new_colbuf_size[1];
  (cm->cdef_info).allocated_linebuf_size[2] = new_linebuf_size[2];
  (cm->cdef_info).allocated_linebuf_size[0] = new_linebuf_size[0];
  (cm->cdef_info).allocated_linebuf_size[1] = new_linebuf_size[1];
  (cm->cdef_info).allocated_mi_rows = iVar5;
  (cm->cdef_info).allocated_num_workers = num_workers;
  if ((char)local_88 != '\0') {
    uStack_b0 = 0x31c5ce;
    alloc_cdef_bufs(cm,local_80->colbuf,srcbuf,local_9c);
    for (uVar12 = 0; uVar2 = local_9c, uVar11 != uVar12; uVar12 = uVar12 + 1) {
      if ((cm->cdef_info).linebuf[uVar12] == (uint16_t *)0x0) {
        uStack_b0 = 0x31c5f2;
        puVar6 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_linebuf_size[uVar12]);
        (cm->cdef_info).linebuf[uVar12] = puVar6;
        if (puVar6 == (uint16_t *)0x0) {
          uStack_b0 = 0x31c614;
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate linebuf[plane]");
        }
      }
    }
    if (1 < num_workers) {
      if (local_a0 != 0) {
        if (*cdef_worker == (AV1CdefWorkerData *)0x0) {
          uStack_b0 = 0x31c63f;
          pAVar7 = (AV1CdefWorkerData *)aom_calloc(local_90,0x1f8);
          *cdef_worker = pAVar7;
          if (pAVar7 == (AV1CdefWorkerData *)0x0) {
            uStack_b0 = 0x31c65c;
            aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_worker");
          }
        }
        lVar13 = local_90 * 0x1f8 + -0x1e8;
        for (; 1 < num_workers; num_workers = num_workers + -1) {
          uStack_b0 = 0x31c68a;
          alloc_cdef_bufs(cm,(uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + -0x10),
                          (uint16_t **)((long)(*cdef_worker)->colbuf + lVar13 + 8),uVar2);
          lVar13 = lVar13 + -0x1f8;
        }
      }
      if (local_a8->cdef_row_mt == (AV1CdefRowSync *)0x0) {
        uVar2 = (cm->cdef_info).allocated_mi_rows;
        uStack_b0 = 0x31c6c1;
        pAVar8 = (AV1CdefRowSync *)aom_calloc((long)(int)uVar2,0x18);
        local_a8->cdef_row_mt = pAVar8;
        if (pAVar8 == (AV1CdefRowSync *)0x0) {
          uStack_b0 = 0x31c6e3;
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_row_mt");
        }
        pAVar4 = local_a8;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (lVar13 = 0; (ulong)uVar2 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
          uStack_b0 = 0x31c70c;
          pvVar9 = aom_malloc(0x28);
          *(void **)((long)&pAVar4->cdef_row_mt->row_mutex_ + lVar13) = pvVar9;
          __mutex = *(pthread_mutex_t **)((long)&pAVar4->cdef_row_mt->row_mutex_ + lVar13);
          if (__mutex == (pthread_mutex_t *)0x0) {
            uStack_b0 = 0x31c736;
            aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate (*cdef_row_mt)[row_idx].row_mutex_");
            __mutex = *(pthread_mutex_t **)((long)&pAVar4->cdef_row_mt->row_mutex_ + lVar13);
          }
          uStack_b0 = 0x31c745;
          pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
          uStack_b0 = 0x31c74d;
          pvVar9 = aom_malloc(0x30);
          *(void **)((long)&pAVar4->cdef_row_mt->row_cond_ + lVar13) = pvVar9;
          __cond = *(pthread_cond_t **)((long)&pAVar4->cdef_row_mt->row_cond_ + lVar13);
          if (__cond == (pthread_cond_t *)0x0) {
            uStack_b0 = 0x31c779;
            aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate (*cdef_row_mt)[row_idx].row_cond_");
            __cond = *(pthread_cond_t **)((long)&local_a8->cdef_row_mt->row_cond_ + lVar13);
          }
          uStack_b0 = 0x31c78d;
          pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_alloc_cdef_buffers(AV1_COMMON *const cm,
                            AV1CdefWorkerData **cdef_worker,
                            AV1CdefSync *cdef_sync, int num_workers,
                            int init_worker) {
  const int num_planes = av1_num_planes(cm);
  size_t new_linebuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_colbuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_srcbuf_size = 0;
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check for configuration change
  const int num_mi_rows =
      (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int is_num_workers_changed =
      cdef_info->allocated_num_workers != num_workers;
  const int is_cdef_enabled =
      cm->seq_params->enable_cdef && !cm->tiles.single_tile_decoding;

  // num-bufs=3 represents ping-pong buffers for top linebuf,
  // followed by bottom linebuf.
  // ping-pong is to avoid top linebuf over-write by consecutive row.
  int num_bufs = 3;
  if (num_workers > 1)
    num_bufs = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  if (is_cdef_enabled) {
    // Calculate src buffer size
    new_srcbuf_size = sizeof(*cdef_info->srcbuf) * CDEF_INBUF_SIZE;
    for (int plane = 0; plane < num_planes; plane++) {
      const int shift =
          plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x;
      // Calculate top and bottom line buffer size
      const int luma_stride =
          ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
      new_linebuf_size[plane] = sizeof(*cdef_info->linebuf) * num_bufs *
                                (CDEF_VBORDER << 1) * (luma_stride >> shift);
      // Calculate column buffer size
      const int block_height =
          (CDEF_BLOCKSIZE << (MI_SIZE_LOG2 - shift)) * 2 * CDEF_VBORDER;
      new_colbuf_size[plane] =
          sizeof(*cdef_info->colbuf[plane]) * block_height * CDEF_HBORDER;
    }
  }

  // Free src, line and column buffers for worker 0 in case of reallocation
  free_cdef_linebuf_conditional(cm, new_linebuf_size);
  free_cdef_bufs_conditional(cm, cdef_info->colbuf, &cdef_info->srcbuf,
                             new_colbuf_size, new_srcbuf_size);

  // The flag init_worker indicates if cdef_worker has to be allocated for the
  // frame. This is passed as 1 always from decoder. At encoder side, it is 0
  // when called for parallel frames during FPMT (where cdef_worker is shared
  // across parallel frames) and 1 otherwise.
  if (*cdef_worker != NULL && init_worker) {
    if (is_num_workers_changed) {
      // Free src and column buffers for remaining workers in case of change in
      // num_workers
      for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);

      aom_free(*cdef_worker);
      *cdef_worker = NULL;
    } else if (num_workers > 1) {
      // Free src and column buffers for remaining workers in case of
      // reallocation
      for (int idx = num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs_conditional(cm, (*cdef_worker)[idx].colbuf,
                                   &(*cdef_worker)[idx].srcbuf, new_colbuf_size,
                                   new_srcbuf_size);
    }
  }

  if (cdef_info->allocated_mi_rows != num_mi_rows)
    free_cdef_row_sync(&cdef_sync->cdef_row_mt, cdef_info->allocated_mi_rows);

  // Store allocated sizes for reallocation
  cdef_info->allocated_srcbuf_size = new_srcbuf_size;
  av1_copy(cdef_info->allocated_colbuf_size, new_colbuf_size);
  av1_copy(cdef_info->allocated_linebuf_size, new_linebuf_size);
  // Store configuration to check change in configuration
  cdef_info->allocated_mi_rows = num_mi_rows;
  cdef_info->allocated_num_workers = num_workers;

  if (!is_cdef_enabled) return;

  // Memory allocation of column buffer & source buffer (worker_0).
  alloc_cdef_bufs(cm, cdef_info->colbuf, &cdef_info->srcbuf, num_planes);
  alloc_cdef_linebuf(cm, cdef_info->linebuf, num_planes);

  if (num_workers < 2) return;

  if (init_worker) {
    if (*cdef_worker == NULL)
      CHECK_MEM_ERROR(cm, *cdef_worker,
                      aom_calloc(num_workers, sizeof(**cdef_worker)));

    // Memory allocation of column buffer & source buffer for remaining workers.
    for (int idx = num_workers - 1; idx >= 1; idx--)
      alloc_cdef_bufs(cm, (*cdef_worker)[idx].colbuf,
                      &(*cdef_worker)[idx].srcbuf, num_planes);
  }

  alloc_cdef_row_sync(cm, &cdef_sync->cdef_row_mt,
                      cdef_info->allocated_mi_rows);
}